

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O0

void __thiscall cmRealDirectoryWatcher::StopWatching(cmRealDirectoryWatcher *this)

{
  int iVar1;
  cmRealDirectoryWatcher *this_local;
  
  if (this->Handle != (uv_fs_event_t *)0x0) {
    uv_fs_event_stop(this->Handle);
    iVar1 = uv_is_closing((uv_handle_t *)this->Handle);
    if (iVar1 == 0) {
      uv_close((uv_handle_t *)this->Handle,anon_unknown.dwarf_d2bfe1::on_fs_close);
    }
    this->Handle = (uv_fs_event_t *)0x0;
  }
  cmVirtualDirectoryWatcher::StopWatching(&this->super_cmVirtualDirectoryWatcher);
  return;
}

Assistant:

void StopWatching() final
  {
    if (this->Handle) {
      uv_fs_event_stop(this->Handle);
      if (!uv_is_closing(reinterpret_cast<uv_handle_t*>(this->Handle))) {
        uv_close(reinterpret_cast<uv_handle_t*>(this->Handle), &on_fs_close);
      }
      this->Handle = nullptr;
    }
    cmVirtualDirectoryWatcher::StopWatching();
  }